

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall
CRenderTools::RenderTeeHand
          (CRenderTools *this,CTeeRenderInfo *pInfo,vec2 CenterPos,vec2 Dir,float AngleOffset,
          vec2 PostRotOffset)

{
  IGraphics *pIVar1;
  long in_RSI;
  CRenderTools *in_RDI;
  long in_FS_OFFSET;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float Angle;
  float BaseSize;
  CQuadItem QuadHand;
  CQuadItem QuadOutline;
  vec4 Color;
  vec2 DirY;
  vec2 DirX;
  vec2 HandPos;
  vector2_base<float> *in_stack_ffffffffffffff40;
  CQuadItem *this_00;
  undefined4 in_stack_ffffffffffffff48;
  int Flags;
  float in_stack_ffffffffffffff4c;
  uint Id;
  CQuadItem local_78;
  CQuadItem local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  vector2_base<float> local_48;
  vector2_base<float> local_40;
  vector2_base<float> local_38;
  vector2_base<float> local_30 [2];
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_1c;
  float local_18;
  float fStack_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fVar2 = *(float *)(in_RSI + 0x94) * 0.015625 * 15.0;
  local_18 = in_XMM1_Da;
  fStack_14 = in_XMM1_Db;
  _local_20 = vector2_base<float>::operator+
                        ((vector2_base<float> *)in_RDI,
                         (vector2_base<float> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  angle((vector2_base<float> *)0x1d8da4);
  vector2_base<float>::vector2_base(local_30,-fStack_14,local_18);
  if (local_18 < 0.0) {
    local_38 = vector2_base<float>::operator-(in_stack_ffffffffffffff40);
    local_30[0] = local_38;
  }
  local_40 = vector2_base<float>::operator*((vector2_base<float> *)in_RDI,in_stack_ffffffffffffff4c)
  ;
  vector2_base<float>::operator+=((vector2_base<float> *)&local_20,&local_40);
  local_48 = vector2_base<float>::operator*((vector2_base<float> *)in_RDI,in_stack_ffffffffffffff4c)
  ;
  vector2_base<float>::operator+=((vector2_base<float> *)&local_20,&local_48);
  local_58 = *(undefined8 *)(in_RSI + 100);
  uStack_50 = *(undefined8 *)(in_RSI + 0x6c);
  fVar2 = fVar2 + fVar2;
  this_00 = &local_68;
  IGraphics::CQuadItem::CQuadItem(this_00,local_20.x,aStack_1c.y,fVar2,fVar2);
  local_78.m_X = local_68.m_X;
  local_78.m_Y = local_68.m_Y;
  local_78.m_Width = local_68.m_Width;
  local_78.m_Height = local_68.m_Height;
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x13])(pIVar1,(ulong)*(uint *)(in_RSI + 0xc));
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x17])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x21])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])();
  Flags = 0;
  SelectSprite(in_RDI,(int)in_stack_ffffffffffffff4c,0,(int)((ulong)this_00 >> 0x20),(int)this_00);
  pIVar1 = Graphics(in_RDI);
  Id = 1;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1c])(pIVar1,this_00);
  SelectSprite(in_RDI,Id,Flags,(int)((ulong)this_00 >> 0x20),(int)this_00);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1c])(pIVar1,&local_78,(ulong)Id);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderTeeHand(const CTeeRenderInfo *pInfo, vec2 CenterPos, vec2 Dir, float AngleOffset,
								 vec2 PostRotOffset)
{
	// in-game hand size is 15 when tee size is 64
	float BaseSize = 15.0f * (pInfo->m_Size / 64.0f);

	vec2 HandPos = CenterPos + Dir;
	float Angle = angle(Dir);
	if(Dir.x < 0)
		Angle -= AngleOffset;
	else
		Angle += AngleOffset;

	vec2 DirX = Dir;
	vec2 DirY(-Dir.y,Dir.x);

	if(Dir.x < 0)
		DirY = -DirY;

	HandPos += DirX * PostRotOffset.x;
	HandPos += DirY * PostRotOffset.y;

	const vec4 Color = pInfo->m_aColors[SKINPART_HANDS];
	IGraphics::CQuadItem QuadOutline(HandPos.x, HandPos.y, 2*BaseSize, 2*BaseSize);
	IGraphics::CQuadItem QuadHand = QuadOutline;

	Graphics()->TextureSet(pInfo->m_aTextures[SKINPART_HANDS]);
	Graphics()->QuadsBegin();
	Graphics()->SetColor(Color.r, Color.g, Color.b, Color.a);
	Graphics()->QuadsSetRotation(Angle);

	SelectSprite(SPRITE_TEE_HAND_OUTLINE, 0, 0, 0);
	Graphics()->QuadsDraw(&QuadOutline, 1);
	SelectSprite(SPRITE_TEE_HAND, 0, 0, 0);
	Graphics()->QuadsDraw(&QuadHand, 1);

	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}